

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unixShmMap(sqlite3_file *fd,int iRegion,int szRegion,int bExtend,void **pp)

{
  ushort uVar1;
  long lVar2;
  sqlite3_io_methods *psVar3;
  sqlite3_io_methods *psVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  sqlite3_io_methods *p;
  sqlite3_mutex *psVar9;
  void *pvVar10;
  size_t sVar11;
  uint *puVar12;
  _func_int_sqlite3_file_ptr_sqlite3_int64 *__s;
  int *piVar13;
  ulong uVar14;
  undefined8 uVar15;
  ulong uVar16;
  long lVar17;
  code *zBuf;
  char *pcVar18;
  int iVar19;
  ulong uVar20;
  u64 n;
  char *pcVar21;
  stat sStat;
  int local_118;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c0 [24];
  uint local_a8;
  uint local_a4;
  undefined4 local_a0;
  long local_90;
  
  uVar5 = (*aSyscall[0x19].pCurrent)();
  uVar16 = 1;
  if (0x7fff < (int)uVar5) {
    uVar16 = (ulong)(uVar5 >> 0xf);
  }
  if (fd[8].pMethods == (sqlite3_io_methods *)0x0) {
    iVar8 = sqlite3_initialize();
    if (iVar8 != 0) {
      return 7;
    }
    p = (sqlite3_io_methods *)sqlite3Malloc(0x18);
    if (p == (sqlite3_io_methods *)0x0) {
      return 7;
    }
    *(undefined8 *)p = 0;
    p->xClose = (_func_int_sqlite3_file_ptr *)0x0;
    p->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0;
    if ((sqlite3Config.bCoreMutex != 0) &&
       (psVar9 = (*sqlite3Config.mutex.xMutexAlloc)(0xb), psVar9 != (sqlite3_mutex *)0x0)) {
      (*sqlite3Config.mutex.xMutexEnter)(psVar9);
    }
    psVar3 = fd[2].pMethods;
    __s = psVar3->xTruncate;
    if (__s != (_func_int_sqlite3_file_ptr_sqlite3_int64 *)0x0) goto LAB_001f9ecc;
    psVar4 = fd[7].pMethods;
    iVar7 = (*aSyscall[5].pCurrent)((ulong)*(uint *)&fd[3].pMethods);
    iVar8 = 0x70a;
    if (iVar7 == 0) {
      sVar11 = strlen((char *)psVar4);
      iVar7 = sqlite3_initialize();
      iVar8 = 7;
      if (iVar7 == 0) {
        local_118 = (int)sVar11;
        __s = (_func_int_sqlite3_file_ptr_sqlite3_int64 *)sqlite3Malloc((long)local_118 + 0x46U);
        if (__s != (_func_int_sqlite3_file_ptr_sqlite3_int64 *)0x0) {
          memset(__s,0,(long)local_118 + 0x46U);
          zBuf = __s + 0x40;
          *(code **)(__s + 0x10) = zBuf;
          sqlite3_snprintf(local_118 + 6,(char *)zBuf,"%s-shm",psVar4);
          *(undefined4 *)(__s + 0x18) = 0xffffffff;
          psVar4 = fd[2].pMethods;
          psVar4->xTruncate = __s;
          *(sqlite3_io_methods **)__s = psVar4;
          if (sqlite3Config.bCoreMutex == 0) {
LAB_001fa266:
            if (*(char *)((long)&psVar3->xRead + 5) != '\0') {
LAB_001f9ecc:
              *(_func_int_sqlite3_file_ptr_sqlite3_int64 **)p = __s;
              *(int *)(__s + 0x30) = *(int *)(__s + 0x30) + 1;
              fd[8].pMethods = p;
              if ((sqlite3Config.bCoreMutex != 0) &&
                 (psVar9 = (*sqlite3Config.mutex.xMutexAlloc)(0xb), psVar9 != (sqlite3_mutex *)0x0))
              {
                (*sqlite3Config.mutex.xMutexLeave)(psVar9);
              }
              if (*(sqlite3_mutex **)(__s + 8) == (sqlite3_mutex *)0x0) {
                p->xClose = *(_func_int_sqlite3_file_ptr **)(__s + 0x38);
                *(sqlite3_io_methods **)(__s + 0x38) = p;
              }
              else {
                (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(__s + 8));
                psVar9 = *(sqlite3_mutex **)(__s + 8);
                p->xClose = *(_func_int_sqlite3_file_ptr **)(__s + 0x38);
                *(sqlite3_io_methods **)(__s + 0x38) = p;
                if (psVar9 != (sqlite3_mutex *)0x0) {
                  (*sqlite3Config.mutex.xMutexLeave)(psVar9);
                }
              }
              goto LAB_001f9d20;
            }
            iVar7 = 0;
            iVar8 = sqlite3_uri_boolean((char *)fd[7].pMethods,"readonly_shm",0);
            if (iVar8 == 0) {
              iVar7 = 0x42;
            }
            else {
              __s[0x22] = (code)0x1;
            }
            uVar5 = robust_open((char *)zBuf,iVar7,local_a8 & 0x1ff);
            *(uint *)(__s + 0x18) = uVar5;
            if ((int)uVar5 < 0) {
              iVar8 = 0xe;
              sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0x87ac,
                          "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
              pcVar21 = "open";
              iVar19 = 0xe;
              iVar7 = 0x87ac;
            }
            else {
              iVar8 = (*aSyscall[0x15].pCurrent)();
              if (iVar8 == 0) {
                (*aSyscall[0x14].pCurrent)((ulong)uVar5,(ulong)local_a4,local_a0);
              }
              uVar5 = *(uint *)((fd[2].pMethods)->xTruncate + 0x18);
              if (-1 < (int)uVar5) {
                uStack_d0 = 0;
                local_e8 = 1;
                uStack_e0 = 0x80;
                local_d8 = 1;
                iVar8 = (*aSyscall[7].pCurrent)((ulong)uVar5,6);
                if (iVar8 == -1) {
LAB_001fa3d5:
                  uVar5 = *(uint *)((fd[2].pMethods)->xTruncate + 0x18);
                  if (-1 < (int)uVar5) {
                    local_e8 = 0;
                    uStack_d0 = 0;
                    uStack_e0 = 0x80;
                    local_d8 = 1;
                    iVar8 = (*aSyscall[7].pCurrent)((ulong)uVar5,6);
                    if (iVar8 == -1) {
                      iVar8 = 5;
                      goto LAB_001fa0c9;
                    }
                  }
                  goto LAB_001f9ecc;
                }
              }
              uVar5 = *(uint *)(__s + 0x18);
              do {
                iVar8 = (*aSyscall[6].pCurrent)((ulong)uVar5,0);
                if (-1 < iVar8) {
                  if (iVar8 == 0) goto LAB_001fa3d5;
                  break;
                }
                piVar13 = __errno_location();
              } while (*piVar13 == 4);
              pcVar21 = "ftruncate";
              iVar8 = 0x120a;
              iVar19 = 0x120a;
              iVar7 = 0x87bc;
            }
            unixLogErrorAtLine(iVar19,pcVar21,(char *)zBuf,iVar7);
          }
          else {
            iVar7 = sqlite3_initialize();
            if (iVar7 == 0) {
              psVar9 = (*sqlite3Config.mutex.xMutexAlloc)(0);
              *(sqlite3_mutex **)(__s + 8) = psVar9;
              if (psVar9 != (sqlite3_mutex *)0x0) goto LAB_001fa266;
            }
            else {
              *(long *)(__s + 8) = 0;
            }
          }
        }
      }
    }
LAB_001fa0c9:
    unixShmPurge((unixFile *)fd);
    sqlite3_free(p);
    if (sqlite3Config.bCoreMutex == 0) {
      return iVar8;
    }
    psVar9 = (*sqlite3Config.mutex.xMutexAlloc)(0xb);
    goto joined_r0x001fa0f9;
  }
LAB_001f9d20:
  lVar2 = *(long *)fd[8].pMethods;
  if (*(sqlite3_mutex **)(lVar2 + 8) != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(lVar2 + 8));
  }
  iVar8 = (int)uVar16;
  iVar19 = (iVar8 + iRegion) - (iVar8 + iRegion) % iVar8;
  uVar1 = *(ushort *)(lVar2 + 0x20);
  iVar7 = 0;
  if ((int)(uint)uVar1 < iVar19) {
    *(int *)(lVar2 + 0x1c) = szRegion;
    if ((int)*(uint *)(lVar2 + 0x18) < 0) {
LAB_001f9e17:
      pvVar10 = *(void **)(lVar2 + 0x28);
      iVar6 = sqlite3_initialize();
      iVar7 = 0xc0a;
      if (iVar6 == 0) {
        uVar5 = iVar19 * 8;
        if (iVar19 * 8 < 1) {
          uVar5 = 0;
        }
        pvVar10 = sqlite3Realloc(pvVar10,(ulong)uVar5);
        if (pvVar10 != (void *)0x0) {
          *(void **)(lVar2 + 0x28) = pvVar10;
          uVar20 = (ulong)*(ushort *)(lVar2 + 0x20);
          iVar7 = 0;
          if ((int)(uint)*(ushort *)(lVar2 + 0x20) < iVar19) {
            n = (u64)szRegion;
            do {
              if (-1 < (int)*(uint *)(lVar2 + 0x18)) {
                pvVar10 = (void *)(*aSyscall[0x16].pCurrent)
                                            (0,(long)(szRegion * iVar8),
                                             (ulong)((uint)(*(char *)(lVar2 + 0x22) == '\0') * 2 + 1
                                                    ),1,(ulong)*(uint *)(lVar2 + 0x18),
                                             (uVar20 & 0xffff) * n);
                if (pvVar10 != (void *)0xffffffffffffffff) goto LAB_001fa040;
                pcVar21 = *(char **)(lVar2 + 0x10);
                puVar12 = (uint *)__errno_location();
                uVar5 = *puVar12;
                if (pcVar21 == (char *)0x0) {
                  pcVar21 = "";
                }
                pcVar18 = "mmap";
                iVar7 = 0x150a;
                iVar8 = 0x150a;
                uVar15 = 0x885b;
LAB_001fa197:
                sqlite3_log(iVar8,"os_unix.c:%d: (%d) %s(%s) - %s",uVar15,(ulong)uVar5,pcVar18,
                            pcVar21,"");
                break;
              }
              iVar6 = sqlite3_initialize();
              iVar7 = 7;
              if ((iVar6 != 0) || (pvVar10 = sqlite3Malloc(n), pvVar10 == (void *)0x0)) break;
              memset(pvVar10,0,n);
LAB_001fa040:
              uVar1 = *(ushort *)(lVar2 + 0x20);
              uVar14 = (ulong)uVar1;
              uVar20 = uVar16;
              if (iVar8 != 0) {
                do {
                  *(void **)(*(long *)(lVar2 + 0x28) + uVar14 * 8) = pvVar10;
                  uVar14 = uVar14 + 1;
                  pvVar10 = (void *)((long)pvVar10 + n);
                  uVar20 = uVar20 - 1;
                } while (uVar20 != 0);
              }
              uVar5 = (uint)uVar1 + iVar8;
              uVar20 = (ulong)uVar5;
              *(short *)(lVar2 + 0x20) = (short)uVar5;
              iVar7 = 0;
            } while ((int)(uVar5 & 0xffff) < iVar19);
          }
        }
      }
    }
    else {
      iVar6 = (*aSyscall[5].pCurrent)((ulong)*(uint *)(lVar2 + 0x18),local_c0);
      iVar7 = 0x130a;
      if (iVar6 == 0) {
        iVar7 = iVar19 * szRegion;
        if (local_90 < iVar7) {
          if (bExtend == 0) {
            iVar7 = 0;
            goto LAB_001f9e2d;
          }
          lVar17 = local_90 + 0xfff;
          if (-1 < local_90) {
            lVar17 = local_90;
          }
          iVar6 = iVar7 + 0xfff;
          if (-1 < iVar7) {
            iVar6 = iVar7;
          }
          iVar7 = (int)(lVar17 >> 0xc);
          if (iVar7 < iVar6 >> 0xc) {
            lVar17 = (long)(iVar6 >> 0xc) - (long)iVar7;
            uVar20 = (long)iVar7 << 0xc | 0xfff;
            do {
              iVar7 = seekAndWriteFd(*(int *)(lVar2 + 0x18),uVar20,"",1,(int *)&local_e8);
              if (iVar7 != 1) {
                pcVar21 = *(char **)(lVar2 + 0x10);
                puVar12 = (uint *)__errno_location();
                uVar5 = *puVar12;
                if (pcVar21 == (char *)0x0) {
                  pcVar21 = "";
                }
                pcVar18 = "write";
                iVar7 = 0x130a;
                iVar8 = 0x130a;
                uVar15 = 0x8840;
                goto LAB_001fa197;
              }
              uVar20 = uVar20 + 0x1000;
              lVar17 = lVar17 + -1;
            } while (lVar17 != 0);
          }
        }
        goto LAB_001f9e17;
      }
    }
LAB_001f9e2d:
    uVar1 = *(ushort *)(lVar2 + 0x20);
  }
  if (iRegion < (int)(uint)uVar1) {
    pvVar10 = *(void **)(*(long *)(lVar2 + 0x28) + (long)iRegion * 8);
  }
  else {
    pvVar10 = (void *)0x0;
  }
  *pp = pvVar10;
  iVar8 = 8;
  if (*(char *)(lVar2 + 0x22) == '\0') {
    iVar8 = iVar7;
  }
  if (iVar7 != 0) {
    iVar8 = iVar7;
  }
  psVar9 = *(sqlite3_mutex **)(lVar2 + 8);
joined_r0x001fa0f9:
  if (psVar9 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar9);
  }
  return iVar8;
}

Assistant:

static int unixShmMap(
  sqlite3_file *fd,               /* Handle open on database file */
  int iRegion,                    /* Region to retrieve */
  int szRegion,                   /* Size of regions */
  int bExtend,                    /* True to extend file if necessary */
  void volatile **pp              /* OUT: Mapped memory */
){
  unixFile *pDbFd = (unixFile*)fd;
  unixShm *p;
  unixShmNode *pShmNode;
  int rc = SQLITE_OK;
  int nShmPerMap = unixShmRegionPerMap();
  int nReqRegion;

  /* If the shared-memory file has not yet been opened, open it now. */
  if( pDbFd->pShm==0 ){
    rc = unixOpenSharedMemory(pDbFd);
    if( rc!=SQLITE_OK ) return rc;
  }

  p = pDbFd->pShm;
  pShmNode = p->pShmNode;
  sqlite3_mutex_enter(pShmNode->mutex);
  assert( szRegion==pShmNode->szRegion || pShmNode->nRegion==0 );
  assert( pShmNode->pInode==pDbFd->pInode );
  assert( pShmNode->h>=0 || pDbFd->pInode->bProcessLock==1 );
  assert( pShmNode->h<0 || pDbFd->pInode->bProcessLock==0 );

  /* Minimum number of regions required to be mapped. */
  nReqRegion = ((iRegion+nShmPerMap) / nShmPerMap) * nShmPerMap;

  if( pShmNode->nRegion<nReqRegion ){
    char **apNew;                      /* New apRegion[] array */
    int nByte = nReqRegion*szRegion;   /* Minimum required file size */
    struct stat sStat;                 /* Used by fstat() */

    pShmNode->szRegion = szRegion;

    if( pShmNode->h>=0 ){
      /* The requested region is not mapped into this processes address space.
      ** Check to see if it has been allocated (i.e. if the wal-index file is
      ** large enough to contain the requested region).
      */
      if( osFstat(pShmNode->h, &sStat) ){
        rc = SQLITE_IOERR_SHMSIZE;
        goto shmpage_out;
      }
  
      if( sStat.st_size<nByte ){
        /* The requested memory region does not exist. If bExtend is set to
        ** false, exit early. *pp will be set to NULL and SQLITE_OK returned.
        */
        if( !bExtend ){
          goto shmpage_out;
        }

        /* Alternatively, if bExtend is true, extend the file. Do this by
        ** writing a single byte to the end of each (OS) page being
        ** allocated or extended. Technically, we need only write to the
        ** last page in order to extend the file. But writing to all new
        ** pages forces the OS to allocate them immediately, which reduces
        ** the chances of SIGBUS while accessing the mapped region later on.
        */
        else{
          static const int pgsz = 4096;
          int iPg;

          /* Write to the last byte of each newly allocated or extended page */
          assert( (nByte % pgsz)==0 );
          for(iPg=(sStat.st_size/pgsz); iPg<(nByte/pgsz); iPg++){
            int x = 0;
            if( seekAndWriteFd(pShmNode->h, iPg*pgsz + pgsz-1, "", 1, &x)!=1 ){
              const char *zFile = pShmNode->zFilename;
              rc = unixLogError(SQLITE_IOERR_SHMSIZE, "write", zFile);
              goto shmpage_out;
            }
          }
        }
      }
    }

    /* Map the requested memory region into this processes address space. */
    apNew = (char **)sqlite3_realloc(
        pShmNode->apRegion, nReqRegion*sizeof(char *)
    );
    if( !apNew ){
      rc = SQLITE_IOERR_NOMEM_BKPT;
      goto shmpage_out;
    }
    pShmNode->apRegion = apNew;
    while( pShmNode->nRegion<nReqRegion ){
      int nMap = szRegion*nShmPerMap;
      int i;
      void *pMem;
      if( pShmNode->h>=0 ){
        pMem = osMmap(0, nMap,
            pShmNode->isReadonly ? PROT_READ : PROT_READ|PROT_WRITE, 
            MAP_SHARED, pShmNode->h, szRegion*(i64)pShmNode->nRegion
        );
        if( pMem==MAP_FAILED ){
          rc = unixLogError(SQLITE_IOERR_SHMMAP, "mmap", pShmNode->zFilename);
          goto shmpage_out;
        }
      }else{
        pMem = sqlite3_malloc64(szRegion);
        if( pMem==0 ){
          rc = SQLITE_NOMEM_BKPT;
          goto shmpage_out;
        }
        memset(pMem, 0, szRegion);
      }

      for(i=0; i<nShmPerMap; i++){
        pShmNode->apRegion[pShmNode->nRegion+i] = &((char*)pMem)[szRegion*i];
      }
      pShmNode->nRegion += nShmPerMap;
    }
  }

shmpage_out:
  if( pShmNode->nRegion>iRegion ){
    *pp = pShmNode->apRegion[iRegion];
  }else{
    *pp = 0;
  }
  if( pShmNode->isReadonly && rc==SQLITE_OK ) rc = SQLITE_READONLY;
  sqlite3_mutex_leave(pShmNode->mutex);
  return rc;
}